

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.cpp
# Opt level: O2

void __thiscall
dg::pta::LLVMPointerGraphBuilder::addPHIOperands(LLVMPointerGraphBuilder *this,Function *F)

{
  PSNode *node;
  PSNodesSeq *pPVar1;
  Function *pFVar2;
  Function *pFVar3;
  Function *pFVar4;
  
  for (pFVar3 = F + 0x50; pFVar3 = *(Function **)pFVar3, pFVar3 != F + 0x48; pFVar3 = pFVar3 + 8) {
    pFVar4 = pFVar3 + -0x18;
    if (pFVar3 == (Function *)0x0) {
      pFVar4 = (Function *)0x0;
    }
    for (pFVar2 = pFVar4 + 0x30; pFVar2 = *(Function **)pFVar2, pFVar2 != pFVar4 + 0x28;
        pFVar2 = pFVar2 + 8) {
      if ((pFVar2 != (Function *)0x0) && (pFVar2[-8] == (Function)0x52)) {
        pPVar1 = getNodes(this,(Value *)(pFVar2 + -0x18));
        node = *(pPVar1->_nodes).
                super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                super__Vector_impl_data._M_start;
        if (node != (PSNode *)0x0) {
          addPHIOperands(this,node,(PHINode *)(pFVar2 + -0x18));
        }
      }
    }
  }
  return;
}

Assistant:

void LLVMPointerGraphBuilder::addPHIOperands(const llvm::Function &F) {
    for (const llvm::BasicBlock &B : F) {
        for (const llvm::Instruction &I : B) {
            if (const llvm::PHINode *PHI = llvm::dyn_cast<llvm::PHINode>(&I)) {
                if (PSNode *node = getNodes(PHI)->getSingleNode())
                    addPHIOperands(node, PHI);
            }
        }
    }
}